

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.c
# Opt level: O2

FILE * uv__open_file(char *path)

{
  int __fd;
  FILE *pFVar1;
  
  pFVar1 = (FILE *)0x0;
  __fd = uv__open_cloexec(path,0);
  if (-1 < __fd) {
    pFVar1 = fdopen(__fd,"r");
    if (pFVar1 == (FILE *)0x0) {
      uv__close(__fd);
      pFVar1 = (FILE *)0x0;
    }
  }
  return (FILE *)pFVar1;
}

Assistant:

FILE* uv__open_file(const char* path) {
  int fd;
  FILE* fp;

  fd = uv__open_cloexec(path, O_RDONLY);
  if (fd < 0)
    return NULL;

   fp = fdopen(fd, "r");
   if (fp == NULL)
     uv__close(fd);

   return fp;
}